

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  u8 uVar1;
  short sVar2;
  NameContext *pNVar3;
  Parse *pPVar4;
  SrcList *pSVar5;
  AggInfo *pAVar6;
  ExprList *pEVar7;
  Expr *pEVar8;
  undefined8 in_RAX;
  AggInfo_col *pAVar9;
  AggInfo_func *pAVar10;
  FuncDef *pFVar11;
  uint uVar12;
  int *piVar13;
  ulong uVar14;
  int iVar15;
  ExprList_item *pEVar16;
  int iVar17;
  int i;
  int i_1;
  undefined8 local_38;
  
  pNVar3 = (pWalker->u).pNC;
  pPVar4 = pNVar3->pParse;
  pSVar5 = pNVar3->pSrcList;
  pAVar6 = pNVar3->pAggInfo;
  uVar1 = pExpr->op;
  local_38 = in_RAX;
  if (uVar1 != 0x9a) {
    if (uVar1 == 0x99) {
      if ((pNVar3->ncFlags & 8) != 0) {
        return 0;
      }
      if (pWalker->walkerDepth != (uint)pExpr->op2) {
        return 0;
      }
      iVar15 = pAVar6->nFunc;
      if (iVar15 < 1) {
        uVar14 = 0;
      }
      else {
        pAVar10 = pAVar6->aFunc;
        uVar14 = 0;
        do {
          iVar17 = sqlite3ExprCompare((Parse *)0x0,pAVar10->pExpr,pExpr,-1);
          iVar15 = pAVar6->nFunc;
          if (iVar17 == 0) break;
          uVar12 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar12;
          pAVar10 = pAVar10 + 1;
        } while ((int)uVar12 < iVar15);
      }
      if (iVar15 <= (int)uVar14) {
        uVar1 = pPVar4->db->enc;
        pAVar10 = (AggInfo_func *)
                  sqlite3ArrayAllocate
                            (pPVar4->db,pAVar6->aFunc,0x18,&pAVar6->nFunc,
                             (int *)((long)&local_38 + 4));
        pAVar6->aFunc = pAVar10;
        uVar14 = (ulong)local_38._4_4_;
        if (-1 < (long)uVar14) {
          pAVar10[uVar14].pExpr = pExpr;
          iVar15 = pPVar4->nMem + 1;
          pPVar4->nMem = iVar15;
          pAVar10[uVar14].iMem = iVar15;
          if ((pExpr->x).pList == (ExprList *)0x0) {
            iVar15 = 0;
          }
          else {
            iVar15 = ((pExpr->x).pList)->nExpr;
          }
          pFVar11 = sqlite3FindFunction(pPVar4->db,(pExpr->u).zToken,iVar15,uVar1,'\0');
          pAVar10[uVar14].pFunc = pFVar11;
          iVar15 = -1;
          if ((pExpr->flags & 0x10) != 0) {
            iVar15 = pPVar4->nTab;
            pPVar4->nTab = iVar15 + 1;
          }
          pAVar10[uVar14].iDistinct = iVar15;
        }
      }
      pExpr->iAgg = (i16)uVar14;
      pExpr->pAggInfo = pAVar6;
      return 1;
    }
    if (uVar1 != 0x98) {
      return 0;
    }
  }
  if ((pSVar5 != (SrcList *)0x0) && (iVar15 = pSVar5->nSrc, 0 < iVar15)) {
    piVar13 = &pSVar5->a[0].iCursor;
    do {
      if (pExpr->iTable == *piVar13) {
        if (pAVar6->nColumn < 1) goto LAB_0024b69a;
        piVar13 = &pAVar6->aCol->iColumn;
        uVar14 = 0;
        goto LAB_0024b67d;
      }
      piVar13 = piVar13 + 0x1c;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  return 1;
  while( true ) {
    uVar12 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar12;
    piVar13 = piVar13 + 8;
    if (pAVar6->nColumn == uVar12) break;
LAB_0024b67d:
    if ((piVar13[-1] == pExpr->iTable) && (*piVar13 == (int)pExpr->iColumn)) goto LAB_0024b74c;
  }
LAB_0024b69a:
  pAVar9 = (AggInfo_col *)
           sqlite3ArrayAllocate(pPVar4->db,pAVar6->aCol,0x20,&pAVar6->nColumn,(int *)&local_38);
  pAVar6->aCol = pAVar9;
  uVar14 = (ulong)(int)local_38;
  if (-1 < (long)uVar14) {
    pAVar9[uVar14].pTab = pExpr->pTab;
    iVar15 = pExpr->iTable;
    pAVar9[uVar14].iTable = iVar15;
    sVar2 = pExpr->iColumn;
    pAVar9[uVar14].iColumn = (int)sVar2;
    iVar17 = pPVar4->nMem + 1;
    pPVar4->nMem = iVar17;
    pAVar9[uVar14].iMem = iVar17;
    pAVar9[uVar14].pExpr = pExpr;
    pEVar7 = pAVar6->pGroupBy;
    if ((pEVar7 != (ExprList *)0x0) && (0 < pEVar7->nExpr)) {
      pEVar16 = pEVar7->a;
      iVar17 = 0;
      do {
        pEVar8 = pEVar16->pExpr;
        if (((pEVar8->op == 0x98) && (pEVar8->iTable == iVar15)) && (pEVar8->iColumn == sVar2))
        goto LAB_0024b748;
        iVar17 = iVar17 + 1;
        pEVar16 = pEVar16 + 1;
      } while (pEVar7->nExpr != iVar17);
    }
    iVar17 = pAVar6->nSortingColumn;
    pAVar6->nSortingColumn = iVar17 + 1;
LAB_0024b748:
    pAVar9[uVar14].iSorterColumn = iVar17;
  }
LAB_0024b74c:
  pExpr->pAggInfo = pAVar6;
  pExpr->op = 0x9a;
  pExpr->iAgg = (i16)uVar14;
  return 1;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->pAggInfo;

  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        struct SrcList_item *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.  
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable &&
                  pCol->iColumn==pExpr->iColumn ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0 
            ){
              pCol = &pAggInfo->aCol[k];
              pCol->pTab = pExpr->pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pExpr = pExpr;
              if( pAggInfo->pGroupBy ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN && pE->iTable==pExpr->iTable &&
                      pE->iColumn==pExpr->iColumn ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetVVAProperty(pExpr, EP_NoReduce);
            pExpr->pAggInfo = pAggInfo;
            pExpr->op = TK_AGG_COLUMN;
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate 
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( sqlite3ExprCompare(0, pItem->pExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( !ExprHasProperty(pExpr, EP_IntValue) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken, 
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}